

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_http_proxy_create_CONNECT
                   (httpreq **preq,Curl_cfilter *cf,Curl_easy *data,int http_version_major)

{
  size_t a_len;
  char *pcVar1;
  char *pcVar2;
  httpreq *local_50;
  httpreq *req;
  _Bool local_3d;
  CURLcode result;
  _Bool ipv6_ip;
  char *pcStack_38;
  int port;
  char *authority;
  char *hostname;
  Curl_easy *pCStack_20;
  int http_version_major_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  httpreq **preq_local;
  
  authority = (char *)0x0;
  pcStack_38 = (char *)0x0;
  local_50 = (httpreq *)0x0;
  hostname._4_4_ = http_version_major;
  pCStack_20 = data;
  data_local = (Curl_easy *)cf;
  cf_local = (Curl_cfilter *)preq;
  req._4_4_ = Curl_http_proxy_get_destination(cf,&authority,(int *)&result,&local_3d);
  if (req._4_4_ == CURLE_OK) {
    pcVar2 = "";
    if ((local_3d & 1U) != 0) {
      pcVar2 = "[";
    }
    pcVar1 = "";
    if ((local_3d & 1U) != 0) {
      pcVar1 = "]";
    }
    pcVar2 = curl_maprintf("%s%s%s:%d",pcVar2,authority,pcVar1,(ulong)result);
    pcStack_38 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      req._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      a_len = strlen(pcVar2);
      req._4_4_ = Curl_http_req_make(&local_50,"CONNECT",7,(char *)0x0,0,pcVar2,a_len,(char *)0x0,0)
      ;
      if ((req._4_4_ == CURLE_OK) &&
         (req._4_4_ = Curl_http_output_auth
                                (pCStack_20,data_local->conn,local_50->method,HTTPREQ_GET,
                                 local_50->authority,true), req._4_4_ == CURLE_OK)) {
        if ((hostname._4_4_ == 1) &&
           (pcVar2 = Curl_checkProxyheaders(pCStack_20,data_local->conn,"Host",4),
           pcVar2 == (char *)0x0)) {
          req._4_4_ = Curl_dynhds_cadd(&local_50->headers,"Host",pcStack_38);
          if (req._4_4_ != CURLE_OK) goto LAB_0015951b;
          req._4_4_ = CURLE_OK;
        }
        if ((pCStack_20->state).aptr.proxyuserpwd != (char *)0x0) {
          req._4_4_ = Curl_dynhds_h1_cadd_line
                                (&local_50->headers,(pCStack_20->state).aptr.proxyuserpwd);
          if (req._4_4_ != CURLE_OK) goto LAB_0015951b;
          req._4_4_ = CURLE_OK;
        }
        pcVar2 = Curl_checkProxyheaders(pCStack_20,data_local->conn,"User-Agent",10);
        if (((pcVar2 == (char *)0x0) && ((pCStack_20->set).str[0x2b] != (char *)0x0)) &&
           (*(pCStack_20->set).str[0x2b] != '\0')) {
          req._4_4_ = Curl_dynhds_cadd(&local_50->headers,"User-Agent",(pCStack_20->set).str[0x2b]);
          if (req._4_4_ != CURLE_OK) goto LAB_0015951b;
          req._4_4_ = CURLE_OK;
        }
        if ((hostname._4_4_ == 1) &&
           (pcVar2 = Curl_checkProxyheaders(pCStack_20,data_local->conn,"Proxy-Connection",0x10),
           pcVar2 == (char *)0x0)) {
          req._4_4_ = Curl_dynhds_cadd(&local_50->headers,"Proxy-Connection","Keep-Alive");
          if (req._4_4_ != CURLE_OK) goto LAB_0015951b;
          req._4_4_ = CURLE_OK;
        }
        req._4_4_ = Curl_dynhds_add_custom(pCStack_20,true,&local_50->headers);
      }
    }
  }
LAB_0015951b:
  if ((req._4_4_ != CURLE_OK) && (local_50 != (httpreq *)0x0)) {
    Curl_http_req_free(local_50);
    local_50 = (httpreq *)0x0;
  }
  (*Curl_cfree)(pcStack_38);
  cf_local->cft = (Curl_cftype *)local_50;
  return req._4_4_;
}

Assistant:

CURLcode Curl_http_proxy_create_CONNECT(struct httpreq **preq,
                                        struct Curl_cfilter *cf,
                                        struct Curl_easy *data,
                                        int http_version_major)
{
  const char *hostname = NULL;
  char *authority = NULL;
  int port;
  bool ipv6_ip;
  CURLcode result;
  struct httpreq *req = NULL;

  result = Curl_http_proxy_get_destination(cf, &hostname, &port, &ipv6_ip);
  if(result)
    goto out;

  authority = aprintf("%s%s%s:%d", ipv6_ip ? "[" : "", hostname,
                      ipv6_ip ?"]" : "", port);
  if(!authority) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = Curl_http_req_make(&req, "CONNECT", sizeof("CONNECT")-1,
                              NULL, 0, authority, strlen(authority),
                              NULL, 0);
  if(result)
    goto out;

  /* Setup the proxy-authorization header, if any */
  result = Curl_http_output_auth(data, cf->conn, req->method, HTTPREQ_GET,
                                 req->authority, TRUE);
  if(result)
    goto out;

  /* If user is not overriding Host: header, we add for HTTP/1.x */
  if(http_version_major == 1 &&
     !Curl_checkProxyheaders(data, cf->conn, STRCONST("Host"))) {
    result = Curl_dynhds_cadd(&req->headers, "Host", authority);
    if(result)
      goto out;
  }

  if(data->state.aptr.proxyuserpwd) {
    result = Curl_dynhds_h1_cadd_line(&req->headers,
                                      data->state.aptr.proxyuserpwd);
    if(result)
      goto out;
  }

  if(!Curl_checkProxyheaders(data, cf->conn, STRCONST("User-Agent")) &&
     data->set.str[STRING_USERAGENT] && *data->set.str[STRING_USERAGENT]) {
    result = Curl_dynhds_cadd(&req->headers, "User-Agent",
                              data->set.str[STRING_USERAGENT]);
    if(result)
      goto out;
  }

  if(http_version_major == 1 &&
    !Curl_checkProxyheaders(data, cf->conn, STRCONST("Proxy-Connection"))) {
    result = Curl_dynhds_cadd(&req->headers, "Proxy-Connection", "Keep-Alive");
    if(result)
      goto out;
  }

  result = Curl_dynhds_add_custom(data, TRUE, &req->headers);

out:
  if(result && req) {
    Curl_http_req_free(req);
    req = NULL;
  }
  free(authority);
  *preq = req;
  return result;
}